

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O3

void DES_set_key_ex(uint8_t *key,DES_key_schedule *schedule)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar2 = (*(uint *)(key + 4) >> 4 ^ *(uint *)key) & 0xf0f0f0f;
  uVar5 = *(uint *)key ^ uVar2;
  uVar3 = uVar2 << 4 ^ *(uint *)(key + 4);
  uVar2 = (uVar5 << 0x12 ^ uVar5) & 0xcccc0000;
  uVar5 = (uVar2 >> 0x12 | uVar2) ^ uVar5;
  uVar2 = (uVar3 << 0x12 ^ uVar3) & 0xcccc0000;
  uVar3 = (uVar2 >> 0x12 | uVar2) ^ uVar3;
  uVar2 = (uVar3 >> 1 ^ uVar5) & 0x55555555;
  uVar5 = uVar5 ^ uVar2;
  uVar3 = uVar2 * 2 ^ uVar3;
  uVar2 = (uVar5 >> 8 ^ uVar3) & 0xff00ff;
  uVar3 = uVar3 ^ uVar2;
  uVar5 = uVar2 << 8 ^ uVar5;
  uVar2 = (uVar3 >> 1 ^ uVar5) & 0x55555555;
  uVar5 = uVar5 ^ uVar2;
  uVar3 = uVar2 * 2 ^ uVar3;
  uVar2 = uVar5 >> 4 & 0xf000000 | uVar3 & 0xff00 | (uVar3 & 0xff) << 0x10 | uVar3 >> 0x10 & 0xff;
  uVar8 = 0;
  do {
    bVar9 = (0x8103UL >> (uVar8 & 0x3f) & 1) != 0;
    bVar4 = 2 - bVar9;
    uVar3 = (uVar5 & 0xfffffff) >> (bVar4 & 0x1f);
    bVar1 = bVar9 | 0x1a;
    uVar5 = uVar5 << bVar1 | uVar3;
    uVar7 = uVar2 >> (bVar4 & 0x1f);
    uVar6 = uVar2 << bVar1 | uVar7;
    uVar3 = des_skb[1][uVar3 >> 7 & 0x3c | uVar3 >> 6 & 3] | des_skb[0][uVar3 & 0x3f] |
            des_skb[2][uVar3 >> 0xe & 0x30 | uVar3 >> 0xd & 0xf] |
            des_skb[3][uVar5 >> 0x16 & 0x38 | uVar3 >> 0x15 & 6 | uVar3 >> 0x14 & 1];
    uVar2 = uVar6 & 0xfffffff;
    uVar6 = des_skb[5][uVar7 >> 8 & 0x3c | uVar7 >> 7 & 3] | des_skb[4][uVar7 & 0x3f] |
            *(uint *)((long)des_skb[6] + (ulong)(uVar7 >> 0xd & 0xfc)) |
            des_skb[7][uVar6 >> 0x16 & 0x30 | uVar7 >> 0x15 & 0xf];
    schedule->subkeys[uVar8][0] = (uVar3 & 0xffff | uVar6 << 0x10) << 2 | (uVar6 << 0x10) >> 0x1e;
    schedule->subkeys[uVar8][1] = (uVar6 & 0xffff0000 | uVar3 >> 0x10) << 6 | uVar6 >> 0x1a;
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x10);
  return;
}

Assistant:

void DES_set_key_ex(const uint8_t key[8], DES_key_schedule *schedule) {
  static const int shifts2[16] = {0, 0, 1, 1, 1, 1, 1, 1,
                                  0, 1, 1, 1, 1, 1, 1, 0};
  uint32_t c, d, t, s, t2;
  const uint8_t *in;
  int i;

  in = key;

  c2l(in, c);
  c2l(in, d);

  // do PC1 in 47 simple operations :-)
  // Thanks to John Fletcher (john_fletcher@lccmail.ocf.llnl.gov)
  // for the inspiration. :-)
  PERM_OP(d, c, t, 4, 0x0f0f0f0f);
  HPERM_OP(c, t, -2, 0xcccc0000);
  HPERM_OP(d, t, -2, 0xcccc0000);
  PERM_OP(d, c, t, 1, 0x55555555);
  PERM_OP(c, d, t, 8, 0x00ff00ff);
  PERM_OP(d, c, t, 1, 0x55555555);
  d = (((d & 0x000000ff) << 16) | (d & 0x0000ff00) |
       ((d & 0x00ff0000) >> 16) | ((c & 0xf0000000) >> 4));
  c &= 0x0fffffff;

  for (i = 0; i < ITERATIONS; i++) {
    if (shifts2[i]) {
      c = ((c >> 2) | (c << 26));
      d = ((d >> 2) | (d << 26));
    } else {
      c = ((c >> 1) | (c << 27));
      d = ((d >> 1) | (d << 27));
    }
    c &= 0x0fffffff;
    d &= 0x0fffffff;
    // could be a few less shifts but I am to lazy at this
    // point in time to investigate
    s = des_skb[0][(c) & 0x3f] |
        des_skb[1][((c >> 6) & 0x03) | ((c >> 7) & 0x3c)] |
        des_skb[2][((c >> 13) & 0x0f) | ((c >> 14) & 0x30)] |
        des_skb[3][((c >> 20) & 0x01) | ((c >> 21) & 0x06) |
                   ((c >> 22) & 0x38)];
    t = des_skb[4][(d) & 0x3f] |
        des_skb[5][((d >> 7) & 0x03) | ((d >> 8) & 0x3c)] |
        des_skb[6][(d >> 15) & 0x3f] |
        des_skb[7][((d >> 21) & 0x0f) | ((d >> 22) & 0x30)];

    // table contained 0213 4657
    t2 = ((t << 16) | (s & 0x0000ffff)) & 0xffffffff;
    schedule->subkeys[i][0] = CRYPTO_rotr_u32(t2, 30);

    t2 = ((s >> 16) | (t & 0xffff0000));
    schedule->subkeys[i][1] = CRYPTO_rotr_u32(t2, 26);
  }
}